

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall cmCTestMultiProcessHandler::StartTest(cmCTestMultiProcessHandler *this,int test)

{
  PropertiesMap *this_00;
  mapped_type *ppcVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  bool bVar5;
  key_type local_34;
  
  this_00 = &this->Properties;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_34);
  p_Var3 = ((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_34);
  bVar5 = (_Rb_tree_header *)p_Var3 ==
          &((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header;
  if (!bVar5) {
    do {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->LockedResources)._M_t,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)iVar2._M_node !=
          &(this->LockedResources)._M_t._M_impl.super__Rb_tree_header) {
        if (!bVar5) goto LAB_0031e348;
        break;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      ppcVar1 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_00->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_34);
      bVar5 = (_Rb_tree_header *)p_Var3 ==
              &((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header;
    } while (!bVar5);
  }
  pmVar4 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::operator[](&(this->Tests).
                         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                        ,&local_34);
  if ((pmVar4->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
      super__Rb_tree_header._M_node_count == 0) {
    StartTestProcess(this,test);
    bVar5 = true;
  }
  else {
LAB_0031e348:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTest(int test)
{
  // Check for locked resources
  for (std::set<std::string>::iterator i =
         this->Properties[test]->LockedResources.begin();
       i != this->Properties[test]->LockedResources.end(); ++i) {
    if (this->LockedResources.find(*i) != this->LockedResources.end()) {
      return false;
    }
  }

  // if there are no depends left then run this test
  if (this->Tests[test].empty()) {
    this->StartTestProcess(test);
    return true;
  }
  // This test was not able to start because it is waiting
  // on depends to run
  return false;
}